

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::InstanceArrayIntersectorKMB<4>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  undefined4 uVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar5;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar6;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  size_t sVar12;
  AABBNodeMB4D *node1;
  ulong uVar13;
  long lVar14;
  size_t sVar15;
  NodeRef *pNVar16;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar17;
  uint uVar18;
  Primitive_conflict4 *prim;
  bool bVar19;
  undefined1 auVar20 [16];
  float fVar21;
  float fVar26;
  float fVar27;
  undefined1 auVar22 [16];
  float fVar28;
  undefined1 auVar23 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar24;
  undefined1 auVar25 [16];
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar36;
  undefined1 auVar32 [16];
  float fVar34;
  float fVar35;
  undefined1 in_ZMM2 [64];
  undefined1 auVar33 [64];
  float fVar37;
  float fVar40;
  float fVar41;
  vint4 ai_2;
  undefined1 auVar38 [16];
  float fVar42;
  undefined1 auVar39 [16];
  vint4 ai_1;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  vint4 ai_3;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  vint4 bi;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  vint4 bi_1;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  vint4 bi_3;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  vint4 ai;
  undefined1 auVar60 [16];
  vint4 bi_2;
  Precalculations pre;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_17b8;
  undefined1 local_17a8 [16];
  vbool<4> valid0;
  InstanceArrayIntersectorKMB<4> local_16e8 [16];
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  sVar15 = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (sVar15 != 8) {
    auVar32 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar25 = vpcmpeqd_avx(auVar32,(undefined1  [16])valid_i->field_0);
    auVar8 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x40,5);
    auVar11 = auVar25 & auVar8;
    if ((((auVar11 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar11 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar11 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar11[0xf] < '\0')
    {
      auVar4 = vandps_avx(auVar8,auVar25);
      auVar8 = *(undefined1 (*) [16])ray;
      auVar25 = *(undefined1 (*) [16])(ray + 0x10);
      auVar11 = *(undefined1 (*) [16])(ray + 0x20);
      auVar23 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x40);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      aVar6.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar23,auVar4);
      local_17a8._4_4_ = auVar4._4_4_ ^ auVar32._4_4_;
      local_17a8._0_4_ = auVar4._0_4_ ^ auVar32._0_4_;
      local_17a8._8_4_ = auVar4._8_4_ ^ auVar32._8_4_;
      local_17a8._12_4_ = auVar4._12_4_ ^ auVar32._12_4_;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = sVar15;
      stack_near[1].field_0 = aVar6;
      if (sVar15 != 0xfffffffffffffff8) {
        auVar30._8_4_ = 0x7fffffff;
        auVar30._0_8_ = 0x7fffffff7fffffff;
        auVar30._12_4_ = 0x7fffffff;
        auVar32 = vandps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar30);
        auVar51._8_4_ = 0x219392ef;
        auVar51._0_8_ = 0x219392ef219392ef;
        auVar51._12_4_ = 0x219392ef;
        auVar32 = vcmpps_avx(auVar32,auVar51,1);
        auVar23 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar51,auVar32);
        auVar32 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar30);
        auVar32 = vcmpps_avx(auVar32,auVar51,1);
        auVar31 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar51,auVar32);
        auVar32 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar30);
        auVar32 = vcmpps_avx(auVar32,auVar51,1);
        auVar32 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar51,auVar32);
        auVar30 = vrcpps_avx(auVar23);
        fVar9 = auVar30._0_4_;
        auVar43._0_4_ = auVar23._0_4_ * fVar9;
        fVar10 = auVar30._4_4_;
        auVar43._4_4_ = auVar23._4_4_ * fVar10;
        fVar29 = auVar30._8_4_;
        auVar43._8_4_ = auVar23._8_4_ * fVar29;
        fVar34 = auVar30._12_4_;
        auVar43._12_4_ = auVar23._12_4_ * fVar34;
        auVar47._8_4_ = 0x3f800000;
        auVar47._0_8_ = 0x3f8000003f800000;
        auVar47._12_4_ = 0x3f800000;
        auVar30 = vsubps_avx(auVar47,auVar43);
        auVar23 = vrcpps_avx(auVar31);
        fVar37 = auVar23._0_4_;
        auVar38._0_4_ = auVar31._0_4_ * fVar37;
        fVar40 = auVar23._4_4_;
        auVar38._4_4_ = auVar31._4_4_ * fVar40;
        fVar41 = auVar23._8_4_;
        auVar38._8_4_ = auVar31._8_4_ * fVar41;
        fVar42 = auVar23._12_4_;
        auVar38._12_4_ = auVar31._12_4_ * fVar42;
        auVar31 = vsubps_avx(auVar47,auVar38);
        auVar23 = vrcpps_avx(auVar32);
        fVar21 = auVar23._0_4_;
        auVar22._0_4_ = auVar32._0_4_ * fVar21;
        fVar26 = auVar23._4_4_;
        auVar22._4_4_ = auVar32._4_4_ * fVar26;
        fVar27 = auVar23._8_4_;
        auVar22._8_4_ = auVar32._8_4_ * fVar27;
        fVar28 = auVar23._12_4_;
        auVar22._12_4_ = auVar32._12_4_ * fVar28;
        auVar32 = vsubps_avx(auVar47,auVar22);
        fVar37 = fVar37 + fVar37 * auVar31._0_4_;
        fVar40 = fVar40 + fVar40 * auVar31._4_4_;
        fVar41 = fVar41 + fVar41 * auVar31._8_4_;
        fVar42 = fVar42 + fVar42 * auVar31._12_4_;
        auVar31._0_4_ = fVar9 + fVar9 * auVar30._0_4_;
        auVar31._4_4_ = fVar10 + fVar10 * auVar30._4_4_;
        auVar31._8_4_ = fVar29 + fVar29 * auVar30._8_4_;
        auVar31._12_4_ = fVar34 + fVar34 * auVar30._12_4_;
        fVar21 = fVar21 + fVar21 * auVar32._0_4_;
        fVar26 = fVar26 + fVar26 * auVar32._4_4_;
        fVar27 = fVar27 + fVar27 * auVar32._8_4_;
        fVar28 = fVar28 + fVar28 * auVar32._12_4_;
        pNVar16 = stack_node + 1;
        auVar32 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT416(0) << 0x20);
        auVar23._8_4_ = 0xff800000;
        auVar23._0_8_ = 0xff800000ff800000;
        auVar23._12_4_ = 0xff800000;
        auVar32 = vblendvps_avx(auVar23,auVar32,auVar4);
        auVar57 = ZEXT1664(auVar32);
        paVar17 = &stack_near[2].field_0;
        auVar32 = vpcmpeqd_avx(auVar31,auVar31);
        auVar33 = ZEXT1664(auVar32);
LAB_00309705:
        do {
          paVar1 = paVar17 + -1;
          paVar17 = paVar17 + -1;
          auVar32 = vcmpps_avx((undefined1  [16])*paVar1,auVar57._0_16_,1);
          local_17b8 = *paVar1;
          if ((((auVar32 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar32 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar32 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar32[0xf]) goto LAB_00309a5d;
          do {
            uVar18 = (uint)sVar15;
            if ((sVar15 & 8) != 0) {
              if (sVar15 == 0xfffffffffffffff8) goto LAB_00309a7e;
              auVar32 = vcmpps_avx(auVar57._0_16_,(undefined1  [16])local_17b8,6);
              if ((((auVar32 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar32 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar32 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar32[0xf]) goto LAB_00309a5d;
              uVar13 = (ulong)(uVar18 & 0xf);
              auVar32 = local_17a8;
              if (uVar13 == 8) goto LAB_00309a3d;
              prim = (Primitive_conflict4 *)(sVar15 & 0xfffffffffffffff0);
              local_17b8._0_8_ = 1;
              aVar5 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(local_17a8 ^ auVar33._0_16_);
              goto LAB_003099b3;
            }
            uVar13 = sVar15 & 0xfffffffffffffff0;
            aVar24.i[2] = 0x7f800000;
            aVar24._0_8_ = 0x7f8000007f800000;
            aVar24.i[3] = 0x7f800000;
            lVar14 = -0x10;
            sVar15 = 8;
            do {
              sVar3 = *(size_t *)(uVar13 + 0x20 + lVar14 * 2);
              if (sVar3 == 8) break;
              fVar9 = *(float *)(uVar13 + 0x90 + lVar14);
              fVar10 = *(float *)(uVar13 + 0x30 + lVar14);
              auVar32 = *(undefined1 (*) [16])(ray + 0x70);
              fVar29 = auVar32._0_4_;
              fVar34 = auVar32._4_4_;
              fVar35 = auVar32._8_4_;
              fVar36 = auVar32._12_4_;
              auVar39._0_4_ = fVar29 * fVar9 + fVar10;
              auVar39._4_4_ = fVar34 * fVar9 + fVar10;
              auVar39._8_4_ = fVar35 * fVar9 + fVar10;
              auVar39._12_4_ = fVar36 * fVar9 + fVar10;
              fVar9 = *(float *)(uVar13 + 0xb0 + lVar14);
              fVar10 = *(float *)(uVar13 + 0x50 + lVar14);
              auVar44._0_4_ = fVar29 * fVar9 + fVar10;
              auVar44._4_4_ = fVar34 * fVar9 + fVar10;
              auVar44._8_4_ = fVar35 * fVar9 + fVar10;
              auVar44._12_4_ = fVar36 * fVar9 + fVar10;
              fVar9 = *(float *)(uVar13 + 0xd0 + lVar14);
              fVar10 = *(float *)(uVar13 + 0x70 + lVar14);
              auVar48._0_4_ = fVar29 * fVar9 + fVar10;
              auVar48._4_4_ = fVar34 * fVar9 + fVar10;
              auVar48._8_4_ = fVar35 * fVar9 + fVar10;
              auVar48._12_4_ = fVar36 * fVar9 + fVar10;
              fVar9 = *(float *)(uVar13 + 0xa0 + lVar14);
              auVar38 = auVar57._0_16_;
              fVar10 = *(float *)(uVar13 + 0x40 + lVar14);
              auVar52._0_4_ = fVar29 * fVar9 + fVar10;
              auVar52._4_4_ = fVar34 * fVar9 + fVar10;
              auVar52._8_4_ = fVar35 * fVar9 + fVar10;
              auVar52._12_4_ = fVar36 * fVar9 + fVar10;
              fVar9 = *(float *)(uVar13 + 0xc0 + lVar14);
              fVar10 = *(float *)(uVar13 + 0x60 + lVar14);
              auVar55._0_4_ = fVar10 + fVar29 * fVar9;
              auVar55._4_4_ = fVar10 + fVar34 * fVar9;
              auVar55._8_4_ = fVar10 + fVar35 * fVar9;
              auVar55._12_4_ = fVar10 + fVar36 * fVar9;
              fVar9 = *(float *)(uVar13 + 0xe0 + lVar14);
              fVar10 = *(float *)(uVar13 + 0x80 + lVar14);
              auVar58._0_4_ = fVar9 * fVar29 + fVar10;
              auVar58._4_4_ = fVar9 * fVar34 + fVar10;
              auVar58._8_4_ = fVar9 * fVar35 + fVar10;
              auVar58._12_4_ = fVar9 * fVar36 + fVar10;
              auVar23 = vsubps_avx(auVar39,auVar8);
              auVar60._0_4_ = auVar31._0_4_ * auVar23._0_4_;
              auVar60._4_4_ = auVar31._4_4_ * auVar23._4_4_;
              auVar60._8_4_ = auVar31._8_4_ * auVar23._8_4_;
              auVar60._12_4_ = auVar31._12_4_ * auVar23._12_4_;
              auVar23 = vsubps_avx(auVar44,auVar25);
              auVar45._0_4_ = fVar37 * auVar23._0_4_;
              auVar45._4_4_ = fVar40 * auVar23._4_4_;
              auVar45._8_4_ = fVar41 * auVar23._8_4_;
              auVar45._12_4_ = fVar42 * auVar23._12_4_;
              auVar23 = vsubps_avx(auVar48,auVar11);
              auVar49._0_4_ = fVar21 * auVar23._0_4_;
              auVar49._4_4_ = fVar26 * auVar23._4_4_;
              auVar49._8_4_ = fVar27 * auVar23._8_4_;
              auVar49._12_4_ = fVar28 * auVar23._12_4_;
              auVar23 = vsubps_avx(auVar52,auVar8);
              auVar53._0_4_ = auVar31._0_4_ * auVar23._0_4_;
              auVar53._4_4_ = auVar31._4_4_ * auVar23._4_4_;
              auVar53._8_4_ = auVar31._8_4_ * auVar23._8_4_;
              auVar53._12_4_ = auVar31._12_4_ * auVar23._12_4_;
              auVar23 = vsubps_avx(auVar55,auVar25);
              auVar56._0_4_ = fVar37 * auVar23._0_4_;
              auVar56._4_4_ = fVar40 * auVar23._4_4_;
              auVar56._8_4_ = fVar41 * auVar23._8_4_;
              auVar56._12_4_ = fVar42 * auVar23._12_4_;
              auVar23 = vsubps_avx(auVar58,auVar11);
              auVar59._0_4_ = fVar21 * auVar23._0_4_;
              auVar59._4_4_ = fVar26 * auVar23._4_4_;
              auVar59._8_4_ = fVar27 * auVar23._8_4_;
              auVar59._12_4_ = fVar28 * auVar23._12_4_;
              auVar23 = vpminsd_avx(auVar60,auVar53);
              auVar30 = vpminsd_avx(auVar45,auVar56);
              auVar23 = vpmaxsd_avx(auVar23,auVar30);
              auVar30 = vpminsd_avx(auVar49,auVar59);
              auVar23 = vpmaxsd_avx(auVar23,auVar30);
              auVar30 = vpmaxsd_avx(auVar60,auVar53);
              auVar22 = vpmaxsd_avx(auVar45,auVar56);
              auVar57 = ZEXT1664(auVar38);
              auVar22 = vpminsd_avx(auVar30,auVar22);
              auVar30 = vpmaxsd_avx(auVar49,auVar59);
              auVar30 = vpminsd_avx(auVar30,auVar38);
              auVar22 = vpminsd_avx(auVar22,auVar30);
              auVar30 = vpmaxsd_avx(auVar23,(undefined1  [16])aVar6);
              if ((uVar18 & 7) == 6) {
                auVar30 = vcmpps_avx(auVar30,auVar22,2);
                uVar2 = *(undefined4 *)(uVar13 + 0xf0 + lVar14);
                auVar50._4_4_ = uVar2;
                auVar50._0_4_ = uVar2;
                auVar50._8_4_ = uVar2;
                auVar50._12_4_ = uVar2;
                auVar22 = vcmpps_avx(auVar50,auVar32,2);
                uVar2 = *(undefined4 *)(uVar13 + 0x100 + lVar14);
                auVar54._4_4_ = uVar2;
                auVar54._0_4_ = uVar2;
                auVar54._8_4_ = uVar2;
                auVar54._12_4_ = uVar2;
                auVar32 = vcmpps_avx(auVar32,auVar54,1);
                auVar32 = vandps_avx(auVar22,auVar32);
                auVar32 = vandps_avx(auVar32,auVar30);
              }
              else {
                auVar32 = vcmpps_avx(auVar30,auVar22,2);
              }
              auVar30 = vcmpps_avx(auVar38,(undefined1  [16])local_17b8,6);
              auVar32 = vandps_avx(auVar32,auVar30);
              auVar32 = vpslld_avx(auVar32,0x1f);
              sVar12 = sVar15;
              aVar7 = aVar24;
              if (((((auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar32[0xf] < '\0') &&
                 (auVar46._8_4_ = 0x7f800000, auVar46._0_8_ = 0x7f8000007f800000,
                 auVar46._12_4_ = 0x7f800000,
                 aVar7 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vblendvps_avx(auVar46,auVar23,auVar32), sVar12 = sVar3, sVar15 != 8)) {
                pNVar16->ptr = sVar15;
                pNVar16 = pNVar16 + 1;
                *paVar17 = aVar24;
                paVar17 = paVar17 + 1;
              }
              aVar24 = aVar7;
              sVar15 = sVar12;
              lVar14 = lVar14 + 4;
            } while (lVar14 != 0);
            auVar32 = vpcmpeqd_avx((undefined1  [16])aVar24,(undefined1  [16])aVar24);
            auVar33 = ZEXT1664(auVar32);
            local_17b8 = aVar24;
          } while (sVar15 != 8);
          sVar15 = pNVar16[-1].ptr;
          pNVar16 = pNVar16 + -1;
        } while (sVar15 != 0xfffffffffffffff8);
      }
LAB_00309a7e:
      auVar8 = vandps_avx(auVar4,local_17a8);
      auVar25._8_4_ = 0xff800000;
      auVar25._0_8_ = 0xff800000ff800000;
      auVar25._12_4_ = 0xff800000;
      auVar8 = vmaskmovps_avx(auVar8,auVar25);
      *(undefined1 (*) [16])(ray + 0x80) = auVar8;
    }
  }
  return;
  while( true ) {
    prim = prim + 1;
    bVar19 = uVar13 - 8 <= (ulong)local_17b8._0_8_;
    local_17b8._0_8_ = local_17b8._0_8_ + 1;
    if (bVar19) break;
LAB_003099b3:
    valid0.field_0 = aVar5;
    InstanceArrayIntersectorKMB<4>::occluded(local_16e8,&valid0,&pre,ray,context,prim);
    aVar5.v = (__m128)vandnps_avx((undefined1  [16])local_16e8,valid0.field_0);
    auVar32 = (undefined1  [16])valid0.field_0 & ~(undefined1  [16])local_16e8;
    if ((((auVar32 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar32 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar32 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar32[0xf])
    break;
  }
  auVar23 = vpcmpeqd_avx((undefined1  [16])valid0.field_0,(undefined1  [16])valid0.field_0);
  auVar33 = ZEXT1664(auVar23);
  auVar32._0_4_ = aVar5.i[0] ^ auVar23._0_4_;
  auVar32._4_4_ = aVar5.i[1] ^ auVar23._4_4_;
  auVar32._8_4_ = aVar5.i[2] ^ auVar23._8_4_;
  auVar32._12_4_ = aVar5.i[3] ^ auVar23._12_4_;
LAB_00309a3d:
  local_17a8 = vpor_avx(local_17a8,auVar32);
  auVar32 = auVar33._0_16_ & ~local_17a8;
  if ((((auVar32 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar32 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar32 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar32[0xf])
  goto LAB_00309a7e;
  auVar20._8_4_ = 0xff800000;
  auVar20._0_8_ = 0xff800000ff800000;
  auVar20._12_4_ = 0xff800000;
  auVar32 = vblendvps_avx(auVar57._0_16_,auVar20,local_17a8);
  auVar57 = ZEXT1664(auVar32);
LAB_00309a5d:
  sVar15 = pNVar16[-1].ptr;
  pNVar16 = pNVar16 + -1;
  if (sVar15 == 0xfffffffffffffff8) goto LAB_00309a7e;
  goto LAB_00309705;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }